

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O0

void __thiscall test_matrix_sparse_resize_Test::TestBody(test_matrix_sparse_resize_Test *this)

{
  initializer_list<double> value;
  initializer_list<double> value_00;
  initializer_list<double> value_01;
  initializer_list<double> value_02;
  initializer_list<double> value_03;
  initializer_list<double> value_04;
  initializer_list<unsigned_long> index;
  initializer_list<unsigned_long> non_zero;
  initializer_list<unsigned_long> index_00;
  initializer_list<unsigned_long> non_zero_00;
  initializer_list<unsigned_long> index_01;
  initializer_list<unsigned_long> non_zero_01;
  initializer_list<unsigned_long> index_02;
  initializer_list<unsigned_long> non_zero_02;
  initializer_list<unsigned_long> index_03;
  initializer_list<unsigned_long> non_zero_03;
  initializer_list<unsigned_long> index_04;
  initializer_list<unsigned_long> non_zero_04;
  bool bVar1;
  char *pcVar2;
  Scalar *pSVar3;
  char *in_R9;
  AssertHelper local_f78;
  Message local_f70;
  int local_f64;
  size_t local_f60;
  undefined1 local_f58 [8];
  AssertionResult gtest_ar_32;
  Message local_f40;
  int local_f34;
  size_t local_f30;
  undefined1 local_f28 [8];
  AssertionResult gtest_ar_31;
  Message local_f10;
  int local_f04;
  size_t local_f00;
  undefined1 local_ef8 [8];
  AssertionResult gtest_ar_30;
  size_t local_ee0;
  double local_ed8 [8];
  iterator local_e98;
  undefined8 uStack_e90;
  unsigned_long local_e88 [8];
  iterator local_e48;
  undefined8 local_e40;
  unsigned_long local_e38 [5];
  iterator local_e10;
  undefined8 local_e08;
  Matrix_Sparse local_e00;
  AssertHelper local_db0;
  Message local_da8;
  double local_da0;
  size_t local_d98 [2];
  undefined1 local_d88 [16];
  undefined1 local_d78 [8];
  AssertionResult gtest_ar_29;
  Message local_d60;
  int local_d54;
  pointer local_d50;
  undefined1 local_d48 [8];
  AssertionResult gtest_ar_28;
  Message local_d30;
  int local_d24;
  size_t local_d20;
  undefined1 local_d18 [8];
  AssertionResult gtest_ar_27;
  Message local_d00;
  int local_cf4;
  size_t local_cf0;
  undefined1 local_ce8 [8];
  AssertionResult gtest_ar_26;
  size_t local_cd0;
  double local_cc8 [8];
  iterator local_c88;
  undefined8 uStack_c80;
  unsigned_long local_c78 [8];
  iterator local_c38;
  undefined8 local_c30;
  unsigned_long local_c28 [6];
  iterator local_bf8;
  undefined8 local_bf0;
  Matrix_Sparse local_be8;
  AssertHelper local_b98;
  Message local_b90;
  double local_b88;
  size_t local_b80 [2];
  undefined1 local_b70 [16];
  undefined1 local_b60 [8];
  AssertionResult gtest_ar_25;
  Message local_b48;
  pointer local_b40;
  pointer local_b38;
  pointer local_b30;
  undefined1 local_b28 [16];
  undefined1 local_b18 [8];
  AssertionResult gtest_ar_24;
  Message local_b00;
  int local_af4;
  pointer local_af0;
  undefined1 local_ae8 [8];
  AssertionResult gtest_ar_23;
  Message local_ad0;
  int local_ac4;
  size_t local_ac0;
  undefined1 local_ab8 [8];
  AssertionResult gtest_ar_22;
  Message local_aa0;
  int local_a94;
  size_t local_a90;
  undefined1 local_a88 [8];
  AssertionResult gtest_ar_21;
  size_t local_a70;
  double local_a68 [8];
  iterator local_a28;
  undefined8 uStack_a20;
  unsigned_long local_a18 [8];
  iterator local_9d8;
  undefined8 local_9d0;
  unsigned_long local_9c8 [5];
  iterator local_9a0;
  undefined8 local_998;
  Matrix_Sparse local_990;
  AssertHelper local_940;
  Message local_938;
  double local_930;
  size_t local_928 [2];
  undefined1 local_918 [16];
  undefined1 local_908 [8];
  AssertionResult gtest_ar_20;
  Message local_8f0;
  pointer local_8e8;
  pointer local_8e0;
  pointer local_8d8;
  undefined1 local_8d0 [16];
  undefined1 local_8c0 [8];
  AssertionResult gtest_ar_19;
  Message local_8a8;
  pointer local_8a0;
  pointer local_898;
  pointer local_890;
  undefined1 local_888 [16];
  undefined1 local_878 [8];
  AssertionResult gtest_ar_18;
  Message local_860;
  pointer local_858;
  pointer local_850;
  pointer local_848;
  undefined1 local_840 [16];
  undefined1 local_830 [8];
  AssertionResult gtest_ar_17;
  Message local_818;
  pointer local_810;
  pointer local_808;
  pointer local_800;
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [8];
  AssertionResult gtest_ar_16;
  Message local_7d0;
  int local_7c4;
  pointer local_7c0;
  undefined1 local_7b8 [8];
  AssertionResult gtest_ar_15;
  Message local_7a0;
  int local_794;
  size_t local_790;
  undefined1 local_788 [8];
  AssertionResult gtest_ar_14;
  Message local_770;
  int local_764;
  size_t local_760;
  undefined1 local_758 [8];
  AssertionResult gtest_ar_13;
  size_t local_740;
  double local_738 [8];
  iterator local_6f8;
  undefined8 uStack_6f0;
  unsigned_long local_6e8 [8];
  iterator local_6a8;
  undefined8 local_6a0;
  unsigned_long local_698 [6];
  iterator local_668;
  undefined8 local_660;
  Matrix_Sparse local_658;
  AssertHelper local_608;
  Message local_600;
  double local_5f8;
  size_t local_5f0 [2];
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [8];
  AssertionResult gtest_ar_12;
  Message local_5b8;
  pointer local_5b0;
  pointer local_5a8;
  pointer local_5a0;
  undefined1 local_598 [16];
  undefined1 local_588 [8];
  AssertionResult gtest_ar_11;
  Message local_570;
  int local_564;
  pointer local_560;
  undefined1 local_558 [8];
  AssertionResult gtest_ar_10;
  Message local_540;
  int local_534;
  size_t local_530;
  undefined1 local_528 [8];
  AssertionResult gtest_ar_9;
  Message local_510;
  int local_504;
  size_t local_500;
  undefined1 local_4f8 [8];
  AssertionResult gtest_ar_8;
  size_t local_4e0;
  double local_4d8 [8];
  iterator local_498;
  undefined8 uStack_490;
  unsigned_long local_488 [8];
  iterator local_448;
  undefined8 local_440;
  unsigned_long local_438 [6];
  iterator local_408;
  undefined8 local_400;
  Matrix_Sparse local_3f8;
  AssertHelper local_3a8;
  Message local_3a0;
  int local_394;
  size_t local_390;
  undefined1 local_388 [8];
  AssertionResult gtest_ar_7;
  Message local_370;
  int local_364;
  size_t local_360;
  undefined1 local_358 [8];
  AssertionResult gtest_ar_6;
  Message local_340;
  int local_334;
  size_t local_330;
  undefined1 local_328 [8];
  AssertionResult gtest_ar_5;
  size_t local_310;
  double local_308 [8];
  iterator local_2c8;
  undefined8 uStack_2c0;
  unsigned_long local_2b8 [8];
  iterator local_278;
  undefined8 local_270;
  unsigned_long local_268 [6];
  iterator local_238;
  undefined8 local_230;
  Matrix_Sparse local_228;
  AssertHelper local_1d8;
  Message local_1d0;
  int local_1c8 [2];
  pair<int,_int> local_1c0;
  pair<unsigned_long,_unsigned_long> local_1b8;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_4;
  Message local_190;
  int local_188 [2];
  pair<int,_int> local_180;
  pair<unsigned_long,_unsigned_long> local_178;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_3;
  Message local_150;
  int local_144;
  size_t local_140;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_2;
  Message local_120;
  int local_114;
  size_t local_110;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_1;
  Message local_f0;
  int local_e4;
  size_t local_e0;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_a8;
  Message local_a0;
  bool local_91;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_;
  size_t local_70 [2];
  undefined1 local_60 [8];
  Matrix_Sparse matrix;
  test_matrix_sparse_resize_Test *this_local;
  
  matrix.column_size = (size_t)this;
  Disa::Matrix_Sparse::Matrix_Sparse((Matrix_Sparse *)local_60);
  local_70[1] = 5;
  local_70[0] = 9;
  Disa::Matrix_Sparse::resize((Matrix_Sparse *)local_60,local_70 + 1,local_70);
  local_91 = Disa::Matrix_Sparse::empty((Matrix_Sparse *)local_60);
  local_91 = !local_91;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_90,&local_91,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_90,(AssertionResult *)"matrix.empty()"
               ,"true","false",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x15e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  local_e0 = Disa::Matrix_Sparse::size_row((Matrix_Sparse *)local_60);
  local_e4 = 5;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_d8,"matrix.size_row()","5",&local_e0,&local_e4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x15f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  local_110 = Disa::Matrix_Sparse::size_column((Matrix_Sparse *)local_60);
  local_114 = 9;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_108,"matrix.size_column()","9",&local_110,&local_114);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x160,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  local_140 = Disa::Matrix_Sparse::size_non_zero((Matrix_Sparse *)local_60);
  local_144 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_138,"matrix.size_non_zero()","0",&local_140,&local_144);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x161,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  local_178 = Disa::Matrix_Sparse::size((Matrix_Sparse *)local_60);
  local_188[1] = 5;
  local_188[0] = 9;
  local_180 = std::make_pair<int,int>(local_188 + 1,local_188);
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_168,"matrix.size().first","std::make_pair(5, 9).first",
             &local_178.first,&local_180.first);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x162,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  local_1b8 = Disa::Matrix_Sparse::size((Matrix_Sparse *)local_60);
  local_1c8[1] = 5;
  local_1c8[0] = 9;
  local_1c0 = std::make_pair<int,int>(local_1c8 + 1,local_1c8);
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_1a8,"matrix.size().second","std::make_pair(5, 9).second",
             &local_1b8.second,&local_1c0.second);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x163,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  local_268[2] = 5;
  local_268[3] = 5;
  local_268[0] = 0;
  local_268[1] = 2;
  local_268[4] = 7;
  local_238 = local_268;
  local_230 = 5;
  local_2b8[4] = 3;
  local_2b8[5] = 4;
  local_2b8[2] = 2;
  local_2b8[3] = 0;
  local_2b8[0] = 1;
  local_2b8[1] = 3;
  local_2b8[6] = 3;
  local_278 = local_2b8;
  local_270 = 7;
  local_308[6] = 7.0;
  local_308[4] = 5.0;
  local_308[5] = 6.0;
  local_308[2] = 3.0;
  local_308[3] = 4.0;
  local_308[0] = 1.0;
  local_308[1] = 2.0;
  local_2c8 = local_308;
  uStack_2c0 = 7;
  non_zero_04._M_len = 5;
  non_zero_04._M_array = local_238;
  index_04._M_len = 7;
  index_04._M_array = local_278;
  value._M_len = 7;
  value._M_array = local_2c8;
  Disa::Matrix_Sparse::Matrix_Sparse(&local_228,non_zero_04,index_04,value,5);
  Disa::Matrix_Sparse::operator=((Matrix_Sparse *)local_60,&local_228);
  Disa::Matrix_Sparse::~Matrix_Sparse(&local_228);
  local_310 = 3;
  gtest_ar_5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x5;
  Disa::Matrix_Sparse::resize((Matrix_Sparse *)local_60,&local_310,(size_t *)&gtest_ar_5.message_);
  local_330 = Disa::Matrix_Sparse::size_row((Matrix_Sparse *)local_60);
  local_334 = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_328,"matrix.size_row()","3",&local_330,&local_334);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
  if (!bVar1) {
    testing::Message::Message(&local_340);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_328);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x168,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_340);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
  local_360 = Disa::Matrix_Sparse::size_column((Matrix_Sparse *)local_60);
  local_364 = 5;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_358,"matrix.size_column()","5",&local_360,&local_364);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
  if (!bVar1) {
    testing::Message::Message(&local_370);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_358);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x169,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_370);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
  local_390 = Disa::Matrix_Sparse::size_non_zero((Matrix_Sparse *)local_60);
  local_394 = 5;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_388,"matrix.size_non_zero()","5",&local_390,&local_394);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
  if (!bVar1) {
    testing::Message::Message(&local_3a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_388);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x16a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3a8,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    testing::Message::~Message(&local_3a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
  local_438[2] = 5;
  local_438[3] = 5;
  local_438[0] = 0;
  local_438[1] = 2;
  local_438[4] = 7;
  local_408 = local_438;
  local_400 = 5;
  local_488[4] = 3;
  local_488[5] = 4;
  local_488[2] = 2;
  local_488[3] = 0;
  local_488[0] = 1;
  local_488[1] = 3;
  local_488[6] = 3;
  local_448 = local_488;
  local_440 = 7;
  local_4d8[6] = 7.0;
  local_4d8[4] = 5.0;
  local_4d8[5] = 6.0;
  local_4d8[2] = 3.0;
  local_4d8[3] = 4.0;
  local_4d8[0] = 1.0;
  local_4d8[1] = 2.0;
  local_498 = local_4d8;
  uStack_490 = 7;
  non_zero_03._M_len = 5;
  non_zero_03._M_array = local_408;
  index_03._M_len = 7;
  index_03._M_array = local_448;
  value_00._M_len = 7;
  value_00._M_array = local_498;
  Disa::Matrix_Sparse::Matrix_Sparse(&local_3f8,non_zero_03,index_03,value_00,5);
  Disa::Matrix_Sparse::operator=((Matrix_Sparse *)local_60,&local_3f8);
  Disa::Matrix_Sparse::~Matrix_Sparse(&local_3f8);
  local_4e0 = 4;
  gtest_ar_8.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x2;
  Disa::Matrix_Sparse::resize((Matrix_Sparse *)local_60,&local_4e0,(size_t *)&gtest_ar_8.message_);
  local_500 = Disa::Matrix_Sparse::size_row((Matrix_Sparse *)local_60);
  local_504 = 4;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_4f8,"matrix.size_row()","4",&local_500,&local_504);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f8);
  if (!bVar1) {
    testing::Message::Message(&local_510);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x16f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_510);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_510);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f8);
  local_530 = Disa::Matrix_Sparse::size_column((Matrix_Sparse *)local_60);
  local_534 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_528,"matrix.size_column()","2",&local_530,&local_534);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_528);
  if (!bVar1) {
    testing::Message::Message(&local_540);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_528);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x170,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_540);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_540);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_528);
  local_560 = (pointer)Disa::Matrix_Sparse::size_non_zero((Matrix_Sparse *)local_60);
  local_564 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_558,"matrix.size_non_zero()","2",(unsigned_long *)&local_560,
             &local_564);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_558);
  if (!bVar1) {
    testing::Message::Message(&local_570);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_558);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x171,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_570);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_570);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_558);
  local_5a0 = (pointer)0x0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_598,(size_t *)local_60);
  local_5a8 = (pointer)0x1;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_598,(size_t *)&local_5a8);
  local_5b0 = (pointer)0x3ff0000000000000;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_588,"matrix[0][1]","1.0",pSVar3,(double *)&local_5b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_588);
  if (!bVar1) {
    testing::Message::Message(&local_5b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_588);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x172,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_5b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_5b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_588);
  local_5f0[1] = 1;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_5e0,(size_t *)local_60);
  local_5f0[0] = 0;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_5e0,local_5f0);
  local_5f8 = 4.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_5d0,"matrix[1][0]","4.0",pSVar3,&local_5f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d0);
  if (!bVar1) {
    testing::Message::Message(&local_600);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_608,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x173,pcVar2);
    testing::internal::AssertHelper::operator=(&local_608,&local_600);
    testing::internal::AssertHelper::~AssertHelper(&local_608);
    testing::Message::~Message(&local_600);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d0);
  local_698[2] = 5;
  local_698[3] = 5;
  local_698[0] = 0;
  local_698[1] = 2;
  local_698[4] = 7;
  local_668 = local_698;
  local_660 = 5;
  local_6e8[4] = 3;
  local_6e8[5] = 4;
  local_6e8[2] = 2;
  local_6e8[3] = 0;
  local_6e8[0] = 1;
  local_6e8[1] = 3;
  local_6e8[6] = 3;
  local_6a8 = local_6e8;
  local_6a0 = 7;
  local_738[6] = 7.0;
  local_738[4] = 5.0;
  local_738[5] = 6.0;
  local_738[2] = 3.0;
  local_738[3] = 4.0;
  local_738[0] = 1.0;
  local_738[1] = 2.0;
  local_6f8 = local_738;
  uStack_6f0 = 7;
  non_zero_02._M_len = 5;
  non_zero_02._M_array = local_668;
  index_02._M_len = 7;
  index_02._M_array = local_6a8;
  value_01._M_len = 7;
  value_01._M_array = local_6f8;
  Disa::Matrix_Sparse::Matrix_Sparse(&local_658,non_zero_02,index_02,value_01,5);
  Disa::Matrix_Sparse::operator=((Matrix_Sparse *)local_60,&local_658);
  Disa::Matrix_Sparse::~Matrix_Sparse(&local_658);
  local_740 = 2;
  gtest_ar_13.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x8;
  Disa::Matrix_Sparse::resize((Matrix_Sparse *)local_60,&local_740,(size_t *)&gtest_ar_13.message_);
  local_760 = Disa::Matrix_Sparse::size_row((Matrix_Sparse *)local_60);
  local_764 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_758,"matrix.size_row()","2",&local_760,&local_764);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_758);
  if (!bVar1) {
    testing::Message::Message(&local_770);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_758);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x178,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_770);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_770);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_758);
  local_790 = Disa::Matrix_Sparse::size_column((Matrix_Sparse *)local_60);
  local_794 = 8;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_788,"matrix.size_column()","8",&local_790,&local_794);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_788);
  if (!bVar1) {
    testing::Message::Message(&local_7a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_788);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x179,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_7a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_7a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_788);
  local_7c0 = (pointer)Disa::Matrix_Sparse::size_non_zero((Matrix_Sparse *)local_60);
  local_7c4 = 5;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_7b8,"matrix.size_non_zero()","5",(unsigned_long *)&local_7c0,
             &local_7c4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7b8);
  if (!bVar1) {
    testing::Message::Message(&local_7d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x17a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_7d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_7d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7b8);
  local_800 = (pointer)0x0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_7f8,(size_t *)local_60);
  local_808 = (pointer)0x1;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_7f8,(size_t *)&local_808);
  local_810 = (pointer)0x3ff0000000000000;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_7e8,"matrix[0][1]","1.0",pSVar3,(double *)&local_810);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7e8);
  if (!bVar1) {
    testing::Message::Message(&local_818);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x17b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_818);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7e8);
  local_848 = (pointer)0x0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_840,(size_t *)local_60);
  local_850 = (pointer)0x3;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_840,(size_t *)&local_850);
  local_858 = (pointer)0x4000000000000000;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_830,"matrix[0][3]","2.0",pSVar3,(double *)&local_858);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_830);
  if (!bVar1) {
    testing::Message::Message(&local_860);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_830);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x17c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_860);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_860);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_830);
  local_890 = (pointer)0x1;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_888,(size_t *)local_60);
  local_898 = (pointer)0x0;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_888,(size_t *)&local_898);
  local_8a0 = (pointer)0x4010000000000000;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_878,"matrix[1][0]","4.0",pSVar3,(double *)&local_8a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_878);
  if (!bVar1) {
    testing::Message::Message(&local_8a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_878);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x17d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_8a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_8a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_878);
  local_8d8 = (pointer)0x1;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_8d0,(size_t *)local_60);
  local_8e0 = (pointer)0x2;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_8d0,(size_t *)&local_8e0);
  local_8e8 = (pointer)0x4008000000000000;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_8c0,"matrix[1][2]","3.0",pSVar3,(double *)&local_8e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8c0);
  if (!bVar1) {
    testing::Message::Message(&local_8f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x17e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_8f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_8f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8c0);
  local_928[1] = 1;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_918,(size_t *)local_60);
  local_928[0] = 3;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_918,local_928);
  local_930 = 5.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_908,"matrix[1][3]","5.0",pSVar3,&local_930);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_908);
  if (!bVar1) {
    testing::Message::Message(&local_938);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_908);
    testing::internal::AssertHelper::AssertHelper
              (&local_940,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x17f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_940,&local_938);
    testing::internal::AssertHelper::~AssertHelper(&local_940);
    testing::Message::~Message(&local_938);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_908);
  local_9c8[2] = 5;
  local_9c8[3] = 5;
  local_9c8[0] = 0;
  local_9c8[1] = 2;
  local_9c8[4] = 7;
  local_9a0 = local_9c8;
  local_998 = 5;
  local_a18[4] = 3;
  local_a18[5] = 4;
  local_a18[2] = 2;
  local_a18[3] = 0;
  local_a18[0] = 1;
  local_a18[1] = 3;
  local_a18[6] = 3;
  local_9d8 = local_a18;
  local_9d0 = 7;
  local_a68[6] = 7.0;
  local_a68[4] = 5.0;
  local_a68[5] = 6.0;
  local_a68[2] = 3.0;
  local_a68[3] = 4.0;
  local_a68[0] = 1.0;
  local_a68[1] = 2.0;
  local_a28 = local_a68;
  uStack_a20 = 7;
  non_zero_01._M_len = 5;
  non_zero_01._M_array = local_9a0;
  index_01._M_len = 7;
  index_01._M_array = local_9d8;
  value_02._M_len = 7;
  value_02._M_array = local_a28;
  Disa::Matrix_Sparse::Matrix_Sparse(&local_990,non_zero_01,index_01,value_02,5);
  Disa::Matrix_Sparse::operator=((Matrix_Sparse *)local_60,&local_990);
  Disa::Matrix_Sparse::~Matrix_Sparse(&local_990);
  local_a70 = 10;
  gtest_ar_21.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x2;
  Disa::Matrix_Sparse::resize((Matrix_Sparse *)local_60,&local_a70,(size_t *)&gtest_ar_21.message_);
  local_a90 = Disa::Matrix_Sparse::size_row((Matrix_Sparse *)local_60);
  local_a94 = 10;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_a88,"matrix.size_row()","10",&local_a90,&local_a94);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a88);
  if (!bVar1) {
    testing::Message::Message(&local_aa0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x184,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_aa0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_aa0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a88);
  local_ac0 = Disa::Matrix_Sparse::size_column((Matrix_Sparse *)local_60);
  local_ac4 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_ab8,"matrix.size_column()","2",&local_ac0,&local_ac4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ab8);
  if (!bVar1) {
    testing::Message::Message(&local_ad0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ab8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x185,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_ad0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_ad0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ab8);
  local_af0 = (pointer)Disa::Matrix_Sparse::size_non_zero((Matrix_Sparse *)local_60);
  local_af4 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_ae8,"matrix.size_non_zero()","2",(unsigned_long *)&local_af0,
             &local_af4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ae8);
  if (!bVar1) {
    testing::Message::Message(&local_b00);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ae8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x186,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,&local_b00);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
    testing::Message::~Message(&local_b00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ae8);
  local_b30 = (pointer)0x0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_b28,(size_t *)local_60);
  local_b38 = (pointer)0x1;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_b28,(size_t *)&local_b38);
  local_b40 = (pointer)0x3ff0000000000000;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_b18,"matrix[0][1]","1.0",pSVar3,(double *)&local_b40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b18);
  if (!bVar1) {
    testing::Message::Message(&local_b48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b18);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x187,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_b48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(&local_b48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b18);
  local_b80[1] = 1;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_b70,(size_t *)local_60);
  local_b80[0] = 0;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_b70,local_b80);
  local_b88 = 4.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_b60,"matrix[1][0]","4.0",pSVar3,&local_b88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b60);
  if (!bVar1) {
    testing::Message::Message(&local_b90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b60);
    testing::internal::AssertHelper::AssertHelper
              (&local_b98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x188,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b98,&local_b90);
    testing::internal::AssertHelper::~AssertHelper(&local_b98);
    testing::Message::~Message(&local_b90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b60);
  local_c28[2] = 5;
  local_c28[3] = 5;
  local_c28[0] = 0;
  local_c28[1] = 2;
  local_c28[4] = 7;
  local_bf8 = local_c28;
  local_bf0 = 5;
  local_c78[4] = 3;
  local_c78[5] = 4;
  local_c78[2] = 2;
  local_c78[3] = 0;
  local_c78[0] = 1;
  local_c78[1] = 3;
  local_c78[6] = 3;
  local_c38 = local_c78;
  local_c30 = 7;
  local_cc8[6] = 7.0;
  local_cc8[4] = 5.0;
  local_cc8[5] = 6.0;
  local_cc8[2] = 3.0;
  local_cc8[3] = 4.0;
  local_cc8[0] = 1.0;
  local_cc8[1] = 2.0;
  local_c88 = local_cc8;
  uStack_c80 = 7;
  non_zero_00._M_len = 5;
  non_zero_00._M_array = local_bf8;
  index_00._M_len = 7;
  index_00._M_array = local_c38;
  value_03._M_len = 7;
  value_03._M_array = local_c88;
  Disa::Matrix_Sparse::Matrix_Sparse(&local_be8,non_zero_00,index_00,value_03,5);
  Disa::Matrix_Sparse::operator=((Matrix_Sparse *)local_60,&local_be8);
  Disa::Matrix_Sparse::~Matrix_Sparse(&local_be8);
  local_cd0 = 1;
  gtest_ar_26.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x2;
  Disa::Matrix_Sparse::resize((Matrix_Sparse *)local_60,&local_cd0,(size_t *)&gtest_ar_26.message_);
  local_cf0 = Disa::Matrix_Sparse::size_row((Matrix_Sparse *)local_60);
  local_cf4 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_ce8,"matrix.size_row()","1",&local_cf0,&local_cf4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ce8);
  if (!bVar1) {
    testing::Message::Message(&local_d00);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ce8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x18d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,&local_d00);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
    testing::Message::~Message(&local_d00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ce8);
  local_d20 = Disa::Matrix_Sparse::size_column((Matrix_Sparse *)local_60);
  local_d24 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_d18,"matrix.size_column()","2",&local_d20,&local_d24);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d18);
  if (!bVar1) {
    testing::Message::Message(&local_d30);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d18);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_28.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x18e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_28.message_,&local_d30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_28.message_);
    testing::Message::~Message(&local_d30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d18);
  local_d50 = (pointer)Disa::Matrix_Sparse::size_non_zero((Matrix_Sparse *)local_60);
  local_d54 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_d48,"matrix.size_non_zero()","1",(unsigned_long *)&local_d50,
             &local_d54);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d48);
  if (!bVar1) {
    testing::Message::Message(&local_d60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,399,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,&local_d60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
    testing::Message::~Message(&local_d60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d48);
  local_d98[1] = 0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_d88,(size_t *)local_60);
  local_d98[0] = 1;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_d88,local_d98);
  local_da0 = 1.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_d78,"matrix[0][1]","1.0",pSVar3,&local_da0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d78);
  if (!bVar1) {
    testing::Message::Message(&local_da8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d78);
    testing::internal::AssertHelper::AssertHelper
              (&local_db0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,400,pcVar2);
    testing::internal::AssertHelper::operator=(&local_db0,&local_da8);
    testing::internal::AssertHelper::~AssertHelper(&local_db0);
    testing::Message::~Message(&local_da8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d78);
  local_e38[2] = 5;
  local_e38[3] = 5;
  local_e38[0] = 0;
  local_e38[1] = 2;
  local_e38[4] = 7;
  local_e10 = local_e38;
  local_e08 = 5;
  local_e88[4] = 3;
  local_e88[5] = 4;
  local_e88[2] = 2;
  local_e88[3] = 0;
  local_e88[0] = 1;
  local_e88[1] = 3;
  local_e88[6] = 3;
  local_e48 = local_e88;
  local_e40 = 7;
  local_ed8[6] = 7.0;
  local_ed8[4] = 5.0;
  local_ed8[5] = 6.0;
  local_ed8[2] = 3.0;
  local_ed8[3] = 4.0;
  local_ed8[0] = 1.0;
  local_ed8[1] = 2.0;
  local_e98 = local_ed8;
  uStack_e90 = 7;
  non_zero._M_len = 5;
  non_zero._M_array = local_e10;
  index._M_len = 7;
  index._M_array = local_e48;
  value_04._M_len = 7;
  value_04._M_array = local_e98;
  Disa::Matrix_Sparse::Matrix_Sparse(&local_e00,non_zero,index,value_04,5);
  Disa::Matrix_Sparse::operator=((Matrix_Sparse *)local_60,&local_e00);
  Disa::Matrix_Sparse::~Matrix_Sparse(&local_e00);
  local_ee0 = 0;
  gtest_ar_30.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  Disa::Matrix_Sparse::resize((Matrix_Sparse *)local_60,&local_ee0,(size_t *)&gtest_ar_30.message_);
  local_f00 = Disa::Matrix_Sparse::size_row((Matrix_Sparse *)local_60);
  local_f04 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_ef8,"matrix.size_row()","0",&local_f00,&local_f04);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ef8);
  if (!bVar1) {
    testing::Message::Message(&local_f10);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ef8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_31.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x195,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_31.message_,&local_f10);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_31.message_);
    testing::Message::~Message(&local_f10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ef8);
  local_f30 = Disa::Matrix_Sparse::size_column((Matrix_Sparse *)local_60);
  local_f34 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_f28,"matrix.size_column()","0",&local_f30,&local_f34);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f28);
  if (!bVar1) {
    testing::Message::Message(&local_f40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_32.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x196,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_32.message_,&local_f40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_32.message_);
    testing::Message::~Message(&local_f40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f28);
  local_f60 = Disa::Matrix_Sparse::size_non_zero((Matrix_Sparse *)local_60);
  local_f64 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_f58,"matrix.size_non_zero()","0",&local_f60,&local_f64);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f58);
  if (!bVar1) {
    testing::Message::Message(&local_f70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f58);
    testing::internal::AssertHelper::AssertHelper
              (&local_f78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x197,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f78,&local_f70);
    testing::internal::AssertHelper::~AssertHelper(&local_f78);
    testing::Message::~Message(&local_f70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f58);
  Disa::Matrix_Sparse::~Matrix_Sparse((Matrix_Sparse *)local_60);
  return;
}

Assistant:

TEST(test_matrix_sparse, resize) {
  Matrix_Sparse matrix;

  // check row and column expansion
  matrix.resize(5, 9);
  EXPECT_FALSE(matrix.empty());
  EXPECT_EQ(matrix.size_row(), 5);
  EXPECT_EQ(matrix.size_column(), 9);
  EXPECT_EQ(matrix.size_non_zero(), 0);
  EXPECT_EQ(matrix.size().first, std::make_pair(5, 9).first);
  EXPECT_EQ(matrix.size().second, std::make_pair(5, 9).second);

  // check row reduction
  matrix = Matrix_Sparse({0, 2, 5, 5, 7}, {1, 3, 2, 0, 3, 4, 3}, {1.0, 2.0, 3.0, 4.0, 5.0, 6.0, 7.0}, 5);
  matrix.resize(3, 5);
  EXPECT_EQ(matrix.size_row(), 3);
  EXPECT_EQ(matrix.size_column(), 5);
  EXPECT_EQ(matrix.size_non_zero(), 5);

  // check column reduction
  matrix = Matrix_Sparse({0, 2, 5, 5, 7}, {1, 3, 2, 0, 3, 4, 3}, {1.0, 2.0, 3.0, 4.0, 5.0, 6.0, 7.0}, 5);
  matrix.resize(4, 2);
  EXPECT_EQ(matrix.size_row(), 4);
  EXPECT_EQ(matrix.size_column(), 2);
  EXPECT_EQ(matrix.size_non_zero(), 2);
  EXPECT_EQ(matrix[0][1], 1.0);
  EXPECT_EQ(matrix[1][0], 4.0);

  // check row reduction with column expansion
  matrix = Matrix_Sparse({0, 2, 5, 5, 7}, {1, 3, 2, 0, 3, 4, 3}, {1.0, 2.0, 3.0, 4.0, 5.0, 6.0, 7.0}, 5);
  matrix.resize(2, 8);
  EXPECT_EQ(matrix.size_row(), 2);
  EXPECT_EQ(matrix.size_column(), 8);
  EXPECT_EQ(matrix.size_non_zero(), 5);
  EXPECT_EQ(matrix[0][1], 1.0);
  EXPECT_EQ(matrix[0][3], 2.0);
  EXPECT_EQ(matrix[1][0], 4.0);
  EXPECT_EQ(matrix[1][2], 3.0);
  EXPECT_EQ(matrix[1][3], 5.0);

  // check row expansion with column reduction
  matrix = Matrix_Sparse({0, 2, 5, 5, 7}, {1, 3, 2, 0, 3, 4, 3}, {1.0, 2.0, 3.0, 4.0, 5.0, 6.0, 7.0}, 5);
  matrix.resize(10, 2);
  EXPECT_EQ(matrix.size_row(), 10);
  EXPECT_EQ(matrix.size_column(), 2);
  EXPECT_EQ(matrix.size_non_zero(), 2);
  EXPECT_EQ(matrix[0][1], 1.0);
  EXPECT_EQ(matrix[1][0], 4.0);

  // check row and column reduction
  matrix = Matrix_Sparse({0, 2, 5, 5, 7}, {1, 3, 2, 0, 3, 4, 3}, {1.0, 2.0, 3.0, 4.0, 5.0, 6.0, 7.0}, 5);
  matrix.resize(1, 2);
  EXPECT_EQ(matrix.size_row(), 1);
  EXPECT_EQ(matrix.size_column(), 2);
  EXPECT_EQ(matrix.size_non_zero(), 1);
  EXPECT_EQ(matrix[0][1], 1.0);

  // check zero sizing.
  matrix = Matrix_Sparse({0, 2, 5, 5, 7}, {1, 3, 2, 0, 3, 4, 3}, {1.0, 2.0, 3.0, 4.0, 5.0, 6.0, 7.0}, 5);
  matrix.resize(0, 0);
  EXPECT_EQ(matrix.size_row(), 0);
  EXPECT_EQ(matrix.size_column(), 0);
  EXPECT_EQ(matrix.size_non_zero(), 0);
}